

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O1

void info_print_data_mainmod_with_include(lyout *out,lys_module *mod)

{
  lys_module *plVar1;
  bool bVar2;
  int iVar3;
  lys_module *plVar4;
  lys_node *plVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  lys_node *node;
  char *pcVar9;
  
  plVar4 = lys_main_module(mod);
  ly_print(out,"%-*s",0xb,"Data: ");
  node = plVar4->data;
  if (node != (lys_node *)0x0) {
    bVar2 = true;
    do {
      plVar1 = node->module;
      if (plVar1 == mod || plVar4 == mod) {
        plVar5 = lys_parent(node);
        if (plVar5 == (lys_node *)0x0) {
          iVar3 = strcmp(node->name,"config");
          if (iVar3 == 0) {
            iVar3 = strcmp(node->module->name,"ietf-netconf");
            if (iVar3 == 0) goto LAB_0019bb14;
          }
        }
        pcVar6 = strnodetype(node->nodetype);
        pcVar8 = " (";
        pcVar7 = "";
        if (plVar1 == mod) {
          pcVar8 = "";
        }
        if (bVar2) {
          pcVar9 = "";
          if (plVar1 != mod) {
            pcVar7 = node->module->name;
            pcVar9 = ")";
          }
          bVar2 = false;
          ly_print(out,"%s \"%s\"%s%s%s\n",pcVar6,node->name,pcVar8,pcVar7,pcVar9);
        }
        else {
          pcVar9 = "";
          pcVar7 = "";
          if (plVar1 != mod) {
            pcVar7 = node->module->name;
            pcVar9 = ")";
          }
          bVar2 = false;
          ly_print(out,"%*s%s \"%s\"%s%s%s\n",0xb,"",pcVar6,node->name,pcVar8,pcVar7,pcVar9);
        }
      }
LAB_0019bb14:
      node = node->next;
    } while (node != (lys_node *)0x0);
    if (!bVar2) {
      return;
    }
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_data_mainmod_with_include(struct lyout *out, const struct lys_module *mod)
{
    int first = 1, from_include;
    struct lys_node *node;
    const struct lys_module *mainmod = lys_main_module(mod);

    ly_print(out, "%-*s", INDENT_LEN, "Data: ");

    if (mainmod->data) {
        LY_TREE_FOR(mainmod->data, node) {
            if (node->module != mod) {
                if (mainmod != mod) {
                    continue;
                } else {
                    from_include = 1;
                }
            } else {
                from_include = 0;
            }

            if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
                /* node added by libyang, not actually in the model */
                continue;
            }

            if (first) {
                ly_print(out, "%s \"%s\"%s%s%s\n", strnodetype(node->nodetype), node->name, (from_include ? " (" : ""),
                                                   (from_include ? node->module->name : ""), (from_include ? ")" : ""));
                first = 0;
            } else {
                ly_print(out, "%*s%s \"%s\"%s%s%s\n", INDENT_LEN, "", strnodetype(node->nodetype), node->name,
                        (from_include ? " (" : ""), (from_include ? node->module->name : ""), (from_include ? ")" : ""));
            }
        }
    }

    if (first) {
        ly_print(out, "\n");
    }
}